

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O1

void vflr64(S390Vector *v1,S390Vector *v2,CPUS390XState_conflict *env,_Bool s,_Bool XxC,uint8_t erm,
           uintptr_t retaddr)

{
  byte bVar1;
  float32 fVar2;
  long lVar3;
  undefined3 in_register_00000089;
  bool bVar4;
  uint8_t vec_exc;
  S390Vector tmp;
  byte local_61;
  CPUS390XState_conflict *local_60;
  int local_54;
  S390Vector *local_50;
  undefined8 local_48;
  uint64_t uStack_40;
  
  local_61 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_50 = v1;
  local_54 = s390_swap_bfp_rounding_mode(env,CONCAT31(in_register_00000089,erm));
  lVar3 = 0;
  local_60 = env;
  do {
    fVar2 = float64_to_float32_s390x(v2->doubleword[lVar3],&env->fpu_status);
    *(float32 *)((long)&local_48 + lVar3 * 8 + 4) = fVar2;
    bVar1 = check_ieee_exc(local_60,(uint8_t)lVar3,XxC,&local_61);
    if (bVar1 != 0 || s) break;
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar4);
  s390_restore_bfp_rounding_mode(local_60,local_54);
  if (bVar1 == 0) {
    if (local_61 != 0) {
      local_60->fpc = local_60->fpc | (uint)local_61 << 0x10;
    }
    local_50->doubleword[0] = local_48;
    local_50->doubleword[1] = uStack_40;
    return;
  }
  tcg_s390_vector_exception(local_60,(uint)bVar1,retaddr);
}

Assistant:

static void vflr64(S390Vector *v1, const S390Vector *v2, CPUS390XState *env,
                   bool s, bool XxC, uint8_t erm, uintptr_t retaddr)
{
    uint8_t vxc, vec_exc = 0;
    S390Vector tmp = { 0 };
    int i, old_mode;

    old_mode = s390_swap_bfp_rounding_mode(env, erm);
    for (i = 0; i < 2; i++) {
        float64 a = s390_vec_read_element64(v2, i);
        uint32_t ret = float64_to_float32(a, &env->fpu_status);

        /* place at even element */
        s390_vec_write_element32(&tmp, i * 2, ret);
        /* indicate the source element */
        vxc = check_ieee_exc(env, i, XxC, &vec_exc);
        if (s || vxc) {
            break;
        }
    }
    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_ieee_exc(env, vxc, vec_exc, retaddr);
    *v1 = tmp;
}